

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_osc.c
# Opt level: O2

t_int * osc_perform(t_int *w)

{
  float fVar1;
  float fVar2;
  long lVar3;
  float *pfVar4;
  long lVar5;
  double dVar6;
  t_int tVar7;
  float *pfVar8;
  double dVar9;
  long lVar10;
  ulong uVar11;
  float fVar12;
  double dVar13;
  
  pfVar8 = cos_table;
  lVar3 = w[1];
  pfVar4 = (float *)w[2];
  lVar5 = w[3];
  tVar7 = w[4];
  dVar13 = *(double *)(lVar3 + 0x30) + 1572864.0;
  fVar1 = *(float *)(lVar3 + 0x38);
  lVar10 = 0;
  dVar9 = (double)(*pfVar4 * fVar1) + dVar13;
  while( true ) {
    dVar6 = dVar9;
    uVar11 = (ulong)((uint)((ulong)dVar13 >> 0x20) & 0x1ff);
    fVar12 = (float)((double)((ulong)dVar13 & 0xffffffff | 0x4138000000000000) + -1572864.0);
    if ((int)tVar7 + -1 == (int)lVar10) break;
    fVar2 = pfVar4[lVar10 + 1];
    *(float *)(lVar5 + lVar10 * 4) = fVar12 * (pfVar8[uVar11 + 1] - pfVar8[uVar11]) + pfVar8[uVar11]
    ;
    lVar10 = lVar10 + 1;
    dVar9 = (double)(fVar2 * fVar1) + dVar6;
    dVar13 = dVar6;
  }
  *(float *)(lVar5 + lVar10 * 4) = fVar12 * (pfVar8[uVar11 + 1] - pfVar8[uVar11]) + pfVar8[uVar11];
  *(double *)(lVar3 + 0x30) =
       (double)((ulong)(dVar6 + 803733504.0) & 0xffffffff | 0x41c8000000000000) + -805306368.0;
  return w + 5;
}

Assistant:

static t_int *osc_perform(t_int *w)
{
    t_osc *x = (t_osc *)(w[1]);
    t_sample *in = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    float *tab = cos_table, *addr;
    t_float f1, f2, frac;
    double dphase = x->x_phase + UNITBIT32;
    int normhipart;
    union tabfudge tf;
    float conv = x->x_conv;

    tf.tf_d = UNITBIT32;
    normhipart = tf.tf_i[HIOFFSET];
#if 0
    while (n--)
    {
        tf.tf_d = dphase;
        dphase += *in++ * conv;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
        f1 = addr[0];
        f2 = addr[1];
        *out++ = f1 + frac * (f2 - f1);
    }
#endif
#if 1
        tf.tf_d = dphase;
        dphase += *in++ * conv;
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
        frac = tf.tf_d - UNITBIT32;
    while (--n)
    {
        tf.tf_d = dphase;
            f1 = addr[0];
        dphase += *in++ * conv;
            f2 = addr[1];
        addr = tab + (tf.tf_i[HIOFFSET] & (COSTABSIZE-1));
        tf.tf_i[HIOFFSET] = normhipart;
            *out++ = f1 + frac * (f2 - f1);
        frac = tf.tf_d - UNITBIT32;
    }
            f1 = addr[0];
            f2 = addr[1];
            *out++ = f1 + frac * (f2 - f1);
#endif

    tf.tf_d = UNITBIT32 * COSTABSIZE;
    normhipart = tf.tf_i[HIOFFSET];
    tf.tf_d = dphase + (UNITBIT32 * COSTABSIZE - UNITBIT32);
    tf.tf_i[HIOFFSET] = normhipart;
    x->x_phase = tf.tf_d - UNITBIT32 * COSTABSIZE;
    return (w+5);
}